

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O0

Value * __thiscall Kvm::letToFuncApp(Kvm *this,Value *v)

{
  Value *pVVar1;
  Value *body;
  undefined1 local_38 [8];
  GcGuard guard;
  Value *result2;
  Value *result1;
  Value *v_local;
  Kvm *this_local;
  
  result2 = (Value *)0x0;
  guard.times_ = 0;
  result1 = v;
  v_local = (Value *)this;
  GcGuard::GcGuard((GcGuard *)local_38,&this->gc_);
  GcGuard::pushLocalStackRoot((GcGuard *)local_38,&result2);
  GcGuard::pushLocalStackRoot((GcGuard *)local_38,(Value **)&guard.times_);
  pVVar1 = letParameters(this,result1);
  result2 = pVVar1;
  body = letBody(this,result1);
  result2 = makeLambda(this,pVVar1,body);
  guard.times_ = (long)letArguments(this,result1);
  pVVar1 = makeFuncApplication(this,result2,(Value *)guard.times_);
  result2 = pVVar1;
  GcGuard::~GcGuard((GcGuard *)local_38);
  return pVVar1;
}

Assistant:

const Value* Kvm::letToFuncApp(const Value *v)
{
    const Value *result1 = nullptr;
    const Value *result2 = nullptr;
    
    GcGuard guard{gc_};
    guard.pushLocalStackRoot(&result1);
    guard.pushLocalStackRoot(&result2);
    result1 = letParameters(v);
    result1 = makeLambda(result1, letBody(v));
    result2 = letArguments(v);
    result1 = makeFuncApplication(result1, result2);
    return result1;
}